

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O2

int __thiscall CSTORCommand::doWhat(CSTORCommand *this,CClient *pClient)

{
  EFTPSTATE EVar1;
  int iVar2;
  CPasvDataTransfer *pCVar3;
  CPortDataTransfer *this_00;
  ostream *poVar4;
  allocator local_81;
  string ret;
  string msg;
  string ret_1;
  
  EVar1 = CClient::GetClientState(pClient);
  if (EVar1 == PASV) {
    std::__cxx11::string::string((string *)&msg,"RECVFILE#",(allocator *)&ret);
    CClient::GetUserDir_abi_cxx11_(&ret,pClient);
    iVar2 = chdir(ret._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&ret);
    if (iVar2 != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Current user dir is error,now program will exit.");
      std::endl<char,std::char_traits<char>>(poVar4);
LAB_0010789b:
      exit(-1);
    }
    CClient::GetUserDir_abi_cxx11_(&ret,pClient);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::~string((string *)&ret);
    std::operator+(&ret_1,&msg,"#");
    std::operator+(&ret,&ret_1,&(this->super_CCommand).m_Args);
    std::__cxx11::string::operator=((string *)&msg,(string *)&ret);
    std::__cxx11::string::~string((string *)&ret);
    std::__cxx11::string::~string((string *)&ret_1);
    pCVar3 = CClient::SetClientPasvDataTransfer(pClient);
    CPasvDataTransfer::SetMsg(pCVar3,&msg);
    std::__cxx11::string::string((string *)&ret,"150 Ok to send data.\r\n",(allocator *)&ret_1);
    CClient::sendMsg(pClient,&ret);
    pCVar3 = CClient::SetClientPasvDataTransfer(pClient);
    CClient::GetClientfd(pClient);
    CPasvDataTransfer::SetControlSock(pCVar3);
    pCVar3 = CClient::SetClientPasvDataTransfer(pClient);
    CPasvDataTransfer::SetControlSock(pCVar3);
    CClient::SetClientState(pClient,PASS);
    CClient::SetClientPasvDataTransfer(pClient);
  }
  else {
    EVar1 = CClient::GetClientState(pClient);
    if (EVar1 != PORT) {
      std::__cxx11::string::string
                ((string *)&msg,"425 Use PORT or PASV first.\r\n",(allocator *)&ret);
      CClient::sendMsg(pClient,&msg);
      std::__cxx11::string::~string((string *)&msg);
      return -1;
    }
    std::__cxx11::string::string((string *)&msg,"RECVFILE#",(allocator *)&ret);
    CClient::GetUserDir_abi_cxx11_(&ret,pClient);
    iVar2 = chdir(ret._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&ret);
    if (iVar2 != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Current user dir is error,now program will exit.");
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_0010789b;
    }
    CClient::GetUserDir_abi_cxx11_(&ret,pClient);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::~string((string *)&ret);
    std::operator+(&ret_1,&msg,"#");
    std::operator+(&ret,&ret_1,&(this->super_CCommand).m_Args);
    std::__cxx11::string::operator=((string *)&msg,(string *)&ret);
    std::__cxx11::string::~string((string *)&ret);
    std::__cxx11::string::~string((string *)&ret_1);
    ret._M_dataplus._M_p = (pointer)&ret.field_2;
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&ret_1,"150 Ok to send data.\r\n",&local_81);
    CClient::sendMsg(pClient,&ret_1);
    iVar2 = CClient::GetClientPortIpAndPort(pClient,&ret);
    this_00 = (CPortDataTransfer *)operator_new(0x60);
    CPortDataTransfer::CPortDataTransfer(this_00,&ret,iVar2);
    CPortDataTransfer::SetMsg(this_00,&msg);
    iVar2 = CClient::GetClientfd(pClient);
    CPortDataTransfer::SetControlSock(this_00,iVar2);
    CThread::Run((CThread *)this_00);
    CClient::SetClientState(pClient,PASS);
    std::__cxx11::string::~string((string *)&ret_1);
  }
  std::__cxx11::string::~string((string *)&ret);
  std::__cxx11::string::~string((string *)&msg);
  return 1;
}

Assistant:

int CSTORCommand::doWhat(CClient *pClient){
    if(pClient->GetClientState() == PASV){
        string msg = "RECVFILE#";
        int r = chdir(pClient->GetUserDir().c_str());
        if(r == 0){
            msg += pClient->GetUserDir();
            msg = msg + "#" + m_Args;
            pClient->GetClientPasvDataTransfer()->SetMsg(msg);
            string ret = "150 Ok to send data.\r\n";
            pClient->sendMsg(ret);
            pClient->GetClientPasvDataTransfer()->SetControlSock(pClient->GetClientfd());
            pClient->GetClientPasvDataTransfer()->PostSignal();

            pClient->SetClientState(PASS);
            pClient->SetClientPasvDataTransfer(NULL);
            return 1;
        }
        else{
            cout << "Current user dir is error,now program will exit." << endl;
            exit(-1);
        }
    }
    else if(pClient->GetClientState() == PORT){
        string msg = "RECVFILE#";
        int r = chdir(pClient->GetUserDir().c_str());
        if(r == 0){
            msg += pClient->GetUserDir();
            msg = msg + "#" + m_Args;

            string ip;
            int port;
            string ret = "150 Ok to send data.\r\n";
            pClient->sendMsg(ret);
            port = pClient->GetClientPortIpAndPort(ip);
            CPortDataTransfer *c = new CPortDataTransfer(ip,port);
            c->SetMsg(msg);
            c->SetControlSock(pClient->GetClientfd());
            c->Run();
            pClient->SetClientState(PASS);

            return 1;
        }
        else{
            cout << "Current user dir is error,now program will exit." << endl;
            exit(-1);
        }
    }
    else{
        string ret = "425 Use PORT or PASV first.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}